

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O3

Index __thiscall wasm::Flatten::getTempForBreakTarget(Flatten *this,Name name,Type type)

{
  undefined1 auVar1 [16];
  Index IVar2;
  __node_base_ptr p_Var3;
  mapped_type *pmVar4;
  Type type_00;
  undefined1 local_30 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_30 = name.super_IString.str._M_len;
  type_00.id = (uintptr_t)local_30;
  p_Var3 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->breakTemps)._M_h,
                      name_local.super_IString.str._M_len % (this->breakTemps)._M_h._M_bucket_count,
                      (key_type *)type_00.id,name_local.super_IString.str._M_len);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = type.id;
    IVar2 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .
                            super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .
                            super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar1 << 0x40),type_00);
    pmVar4 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->breakTemps,(key_type *)local_30);
    *pmVar4 = IVar2;
  }
  else {
    IVar2 = *(Index *)&p_Var3->_M_nxt[3]._M_nxt;
  }
  return IVar2;
}

Assistant:

Index getTempForBreakTarget(Name name, Type type) {
    auto iter = breakTemps.find(name);
    if (iter != breakTemps.end()) {
      return iter->second;
    } else {
      return breakTemps[name] =
               Builder(*getModule()).addVar(getFunction(), type);
    }
  }